

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O0

void __thiscall logging_tests::logging_LogPrintMacros::test_method(logging_LogPrintMacros *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  bool bVar1;
  istream *piVar2;
  iterator left_begin;
  iterator left_end;
  iterator right_begin;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_RDI;
  long in_FS_OFFSET;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  log_lines;
  string log;
  ifstream file;
  LogFlags in_stack_fffffffffffffa88;
  uint uVar3;
  undefined4 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *__x;
  char *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffaa8;
  const_string *in_stack_fffffffffffffab0;
  size_t in_stack_fffffffffffffab8;
  const_string *in_stack_fffffffffffffac0;
  allocator<char> *in_stack_fffffffffffffac8;
  iterator in_stack_fffffffffffffad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  LogFlags in_stack_fffffffffffffaf0;
  undefined8 in_stack_fffffffffffffaf8;
  int source_line;
  string *local_4e0;
  ConstevalFormatString<1U> in_stack_fffffffffffffb38;
  size_t in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb48;
  equal_coll_impl *this_02;
  size_t in_stack_fffffffffffffb50;
  char *in_stack_fffffffffffffb58;
  const_string local_3f8;
  Level in_stack_fffffffffffffc30;
  char (*in_stack_fffffffffffffc40) [6];
  allocator<char> local_384;
  equal_coll_impl local_383;
  allocator<char> local_382;
  allocator<char> local_381 [209];
  string local_2b0 [128];
  string local_230 [32];
  istream local_210 [520];
  long local_8;
  
  source_line = (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ::LogAcceptCategory(in_stack_fffffffffffffa88,Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
    uVar3 = (uint)((ulong)in_stack_fffffffffffffa88 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
    in_stack_fffffffffffffa88 = (ulong)uVar3 << 0x20;
    logging_function._M_str = in_stack_fffffffffffffb58;
    logging_function._M_len = in_stack_fffffffffffffb50;
    source_file._M_str = in_stack_fffffffffffffb48;
    source_file._M_len = in_stack_fffffffffffffb40;
    LogPrintFormatInternal<char[5]>
              (logging_function,source_file,source_line,in_stack_fffffffffffffaf0,
               in_stack_fffffffffffffc30,in_stack_fffffffffffffb38,
               (char (*) [5])in_stack_fffffffffffffc40);
  }
  bVar1 = ::LogAcceptCategory(in_stack_fffffffffffffa88,Trace);
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffffa88 >> 0x20);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
    logging_function_00._M_str = in_stack_fffffffffffffb58;
    logging_function_00._M_len = in_stack_fffffffffffffb50;
    source_file_00._M_str = in_stack_fffffffffffffb48;
    source_file_00._M_len = in_stack_fffffffffffffb40;
    LogPrintFormatInternal<char[5]>
              (logging_function_00,source_file_00,source_line,in_stack_fffffffffffffaf0,
               in_stack_fffffffffffffc30,in_stack_fffffffffffffb38,
               (char (*) [5])in_stack_fffffffffffffc40);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
  logging_function_01._M_str = in_stack_fffffffffffffb58;
  logging_function_01._M_len = in_stack_fffffffffffffb50;
  source_file_01._M_str = in_stack_fffffffffffffb48;
  source_file_01._M_len = in_stack_fffffffffffffb40;
  LogPrintFormatInternal<char[5]>
            (logging_function_01,source_file_01,source_line,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffc30,in_stack_fffffffffffffb38,
             (char (*) [5])in_stack_fffffffffffffc40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
  logging_function_02._M_str = in_stack_fffffffffffffb58;
  logging_function_02._M_len = in_stack_fffffffffffffb50;
  source_file_02._M_str = in_stack_fffffffffffffb48;
  source_file_02._M_len = in_stack_fffffffffffffb40;
  LogPrintFormatInternal<char[5]>
            (logging_function_02,source_file_02,source_line,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffc30,in_stack_fffffffffffffb38,
             (char (*) [5])in_stack_fffffffffffffc40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar4,4);
  __x = "foo10: %s\n";
  this_01 = "bar10";
  logging_function_03._M_str = in_stack_fffffffffffffb58;
  logging_function_03._M_len = in_stack_fffffffffffffb50;
  source_file_03._M_str = in_stack_fffffffffffffb48;
  source_file_03._M_len = in_stack_fffffffffffffb40;
  LogPrintFormatInternal<char[6]>
            (logging_function_03,source_file_03,source_line,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffc30,in_stack_fffffffffffffb38,in_stack_fffffffffffffc40);
  std::ifstream::ifstream<fs::path,fs::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)this_01,(path *)__x,
             (openmode)((ulong)this_00 >> 0x20));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00);
  std::__cxx11::string::string(in_stack_fffffffffffffaa0);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_210,local_230);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_01,(value_type *)__x);
  }
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  this_02 = &local_383;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_00);
  __l._M_len = (size_type)in_stack_fffffffffffffad8;
  __l._M_array = in_stack_fffffffffffffad0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffac8,__l,(allocator_type *)in_stack_fffffffffffffac0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  local_4e0 = local_230;
  do {
    local_4e0 = local_4e0 + -0x20;
    std::__cxx11::string::~string(this_00);
  } while (local_4e0 != local_2b0);
  std::allocator<char>::~allocator(&local_384);
  std::allocator<char>::~allocator((allocator<char> *)&local_383);
  std::allocator<char>::~allocator(&local_382);
  std::allocator<char>::~allocator(local_381);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,__x,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
               in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)__x);
    left_begin = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__x);
    left_end = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__x);
    right_begin = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)__x);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (this_02,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )left_begin._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )left_end._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )right_begin._M_current,in_RDI);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)__x,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,__x,(unsigned_long)this_00);
    this_01 = "log_lines.end()";
    __x = "log_lines.begin()";
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffc40,(lazy_ostream *)&stack0xfffffffffffffc18
               ,&local_3f8,0x98,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  std::ifstream::~ifstream(local_210);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(logging_LogPrintMacros, LogSetup)
{
    LogTrace(BCLog::NET, "foo6: %s\n", "bar6"); // not logged
    LogDebug(BCLog::NET, "foo7: %s\n", "bar7");
    LogInfo("foo8: %s\n", "bar8");
    LogWarning("foo9: %s\n", "bar9");
    LogError("foo10: %s\n", "bar10");
    std::ifstream file{tmp_log_path};
    std::vector<std::string> log_lines;
    for (std::string log; std::getline(file, log);) {
        log_lines.push_back(log);
    }
    std::vector<std::string> expected = {
        "[net] foo7: bar7",
        "foo8: bar8",
        "[warning] foo9: bar9",
        "[error] foo10: bar10",
    };
    BOOST_CHECK_EQUAL_COLLECTIONS(log_lines.begin(), log_lines.end(), expected.begin(), expected.end());
}